

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullWriter.cpp
# Opt level: O0

size_t __thiscall adios2::core::engine::NullWriter::CurrentStep(NullWriter *this)

{
  pointer pNVar1;
  allocator local_b1;
  string local_b0 [20];
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
                         *)0xac7e88);
  if ((pNVar1->IsOpen & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Engine",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"NullWriter",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"CurrentStep",
               (allocator *)&stack0xffffffffffffff77);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,"NullWriter::CurrentStep: Engine already closed",&local_b1);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
                         *)0xac80a0);
  return pNVar1->CurrentStep;
}

Assistant:

size_t NullWriter::CurrentStep() const
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Engine", "NullWriter", "CurrentStep",
                                          "NullWriter::CurrentStep: Engine already closed");
    }

    return Impl->CurrentStep;
}